

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

StatementMap *
Js::FunctionBody::GetPrevNonSubexpressionStatementMap
          (StatementMapList *statementMapList,int *startingAtIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  StatementMap *pSVar5;
  int index;
  
  if (statementMapList == (StatementMapList *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xb4f,"(statementMapList != nullptr)",
                                "Must have valid statementMapList to execute");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  index = *startingAtIndex;
  while( true ) {
    pTVar4 = JsUtil::
             List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(statementMapList,index);
    pSVar5 = pTVar4->ptr;
    if (*startingAtIndex == 0) {
      if ((pSVar5->isSubexpression & 1U) != 0) {
        pSVar5 = (StatementMap *)0x0;
      }
      return pSVar5;
    }
    if ((pSVar5->isSubexpression & 1U) == 0) break;
    index = *startingAtIndex + -1;
    *startingAtIndex = index;
  }
  return pSVar5;
}

Assistant:

FunctionBody::StatementMap * FunctionBody::GetPrevNonSubexpressionStatementMap(StatementMapList *statementMapList, int & startingAtIndex)
    {
        AssertMsg(statementMapList != nullptr, "Must have valid statementMapList to execute");

        StatementMap *map = statementMapList->Item(startingAtIndex);
        while (startingAtIndex && map->isSubexpression)
        {
            map = statementMapList->Item(--startingAtIndex);
        }
        if (map->isSubexpression)   // Didn't find any non inner maps
        {
            return nullptr;
        }
        return map;
    }